

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileGuard.h
# Opt level: O1

void __thiscall jbcoin::KeyFileGuard::~KeyFileGuard(KeyFileGuard *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  rmDir(this,&this->subDir_);
  pcVar1 = (this->subDir_).m_pathname._M_dataplus._M_p;
  paVar2 = &(this->subDir_).m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~KeyFileGuard ()
    {
        try
        {
            using namespace boost::filesystem;

            rmDir (subDir_);
        }
        catch (std::exception& e)
        {
            // if we throw here, just let it die.
            test_.log << "Error in ~KeyFileGuard: " << e.what () << std::endl;
        };
    }